

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::StartNextTests(cmCTestMultiProcessHandler *this)

{
  PropertiesMap *this_00;
  pointer pcVar1;
  cmCTest *pcVar2;
  cmCTestMultiProcessHandler *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined7 extraout_var;
  mapped_type *ppcVar6;
  ostream *poVar7;
  undefined8 unaff_RBP;
  ulong uVar8;
  ulong uVar9;
  pointer __k;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  double dVar13;
  unsigned_long systemLoad;
  SystemInformation info;
  TestList copy;
  string testWithMinProcessors;
  string fake_load_value;
  long *local_240;
  long local_238;
  long local_230 [2];
  cmCTestMultiProcessHandler *local_220;
  unsigned_long local_218;
  uint local_20c;
  ulong local_208;
  SystemInformation local_200;
  key_type local_1f4;
  ulong local_1f0;
  vector<int,_std::allocator<int>_> local_1e8;
  char *local_1d0;
  long local_1c8;
  char local_1c0;
  undefined7 uStack_1bf;
  ulong local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  uVar9 = this->ParallelLevel;
  bVar12 = this->RunningCount <= uVar9;
  uVar10 = uVar9 - this->RunningCount;
  uVar8 = 0;
  if (bVar12) {
    uVar8 = uVar10;
  }
  if ((bVar12 && uVar10 != 0) && (this->SerialTestRunning == false)) {
    local_1d0 = &local_1c0;
    local_1c8 = 0;
    local_1c0 = '\0';
    cmsys::SystemInformation::SystemInformation(&local_200);
    local_218 = 0;
    bVar12 = this->TestLoad == 0;
    if (bVar12) {
      uVar11 = 0;
      local_1f0 = 0;
      local_208 = uVar10;
    }
    else {
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = local_1a8 + 0x10;
      bVar4 = cmsys::SystemTools::GetEnv
                        ("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",(string *)local_1a8);
      uVar11 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
      if (bVar4) {
        bVar4 = cmSystemTools::StringToULong((char *)local_1a8._0_8_,&local_218);
        if (!bVar4) {
          cmSystemTools::Error
                    ("Failed to parse fake load value: ",(char *)local_1a8._0_8_,(char *)0x0,
                     (char *)0x0);
        }
      }
      else {
        dVar13 = cmsys::SystemInformation::GetLoadAverage(&local_200);
        dVar13 = ceil(dVar13);
        local_218 = (long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f | (long)dVar13;
      }
      local_1f0 = 0;
      if (local_218 <= this->TestLoad) {
        local_1f0 = this->TestLoad - local_218;
      }
      local_208 = uVar8;
      if (local_1f0 <= uVar8) {
        local_208 = local_1f0;
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
    }
    local_1b0 = uVar11;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_1e8,&(this->SortedTests).super_vector<int,_std::allocator<int>_>);
    local_20c = (uint)CONCAT71((int7)((ulong)unaff_RBP >> 8),!bVar12);
    local_220 = this;
    if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      this_00 = &this->Properties;
      __k = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
      do {
        if (this->SerialTestRunning != false) break;
        ppcVar6 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&this_00->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,__k);
        if (((*ppcVar6)->RunSerial != true) || (uVar8 = local_208, this->RunningCount == 0)) {
          local_1a8._0_4_ = *__k;
          ppcVar6 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&this_00->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,(key_type *)local_1a8);
          uVar10 = (long)(*ppcVar6)->Processors;
          if (this->ParallelLevel < (ulong)(long)(*ppcVar6)->Processors) {
            uVar10 = this->ParallelLevel;
          }
          if (this->TestLoad == 0) {
LAB_0031c88f:
            bVar12 = false;
          }
          else {
            bVar12 = true;
            if (uVar10 <= local_1f0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"OK to run ",10);
              local_1f4 = *__k;
              ppcVar6 = std::
                        map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                        ::operator[](&this_00->
                                      super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                     ,&local_1f4);
              local_240 = local_230;
              pcVar1 = ((*ppcVar6)->Name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_240,pcVar1,pcVar1 + ((*ppcVar6)->Name)._M_string_length);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,(char *)local_240,local_238);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,", it requires ",0xe);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," procs & system load is: ",0x19);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              if (local_240 != local_230) {
                operator_delete(local_240,local_230[0] + 1);
              }
              pcVar2 = this->CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar2,0,
                           "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                           ,0x138,(char *)local_240,false);
              if (local_240 != local_230) {
                operator_delete(local_240,local_230[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              local_20c = 0;
              goto LAB_0031c88f;
            }
          }
          if (uVar10 <= uVar9) {
            local_240 = (long *)CONCAT44(local_240._4_4_,*__k);
            ppcVar6 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&this_00->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,(key_type *)&local_240);
            pcVar1 = ((*ppcVar6)->Name)._M_dataplus._M_p;
            local_1a8._0_8_ = local_1a8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1a8,pcVar1,pcVar1 + ((*ppcVar6)->Name)._M_string_length);
            std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_1a8);
            uVar9 = uVar10;
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1
                             );
            }
          }
          uVar8 = local_208 - uVar10;
          if ((bVar12 || local_208 < uVar10) || (bVar12 = StartTest(local_220,*__k), !bVar12)) {
            this = local_220;
            uVar8 = local_208;
            if (local_208 == 0) break;
          }
          else {
            this = local_220;
            if (local_220->StopTimePassed != false) goto LAB_0031ccb6;
          }
        }
        local_208 = uVar8;
        __k = __k + 1;
      } while (__k != local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    }
    if ((local_20c & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"***** WAITING, ",0xf)
      ;
      uVar9 = local_1b0;
      pcVar3 = local_220;
      pcVar2 = local_220->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x150,(char *)local_240,false);
      if (local_240 != local_230) {
        operator_delete(local_240,local_230[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if (pcVar3->SerialTestRunning == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Waiting for RUN_SERIAL test to finish.",0x26);
        pcVar2 = pcVar3->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x153,(char *)local_240,false);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"System Load: ",0xd)
        ;
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", Max Allowed Load: ",0x14);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", Smallest test ",0x10);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_1d0,local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," requires ",10);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        pcVar2 = pcVar3->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x15a,(char *)local_240,false);
      }
      if (local_240 != local_230) {
        operator_delete(local_240,local_230[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"*****",5);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      pcVar2 = pcVar3->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x15d,(char *)local_240,false);
      if (local_240 != local_230) {
        operator_delete(local_240,local_230[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((char)uVar9 == '\0') {
        uVar5 = cmSystemTools::RandomSeed();
        cmCTestScriptHandler::SleepInSeconds(uVar5 % 5 + 1);
      }
      else {
        pcVar3->StopTimePassed = true;
      }
    }
LAB_0031ccb6:
    if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (key_type *)0x0) {
      operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    cmsys::SystemInformation::~SystemInformation(&local_200);
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTests()
{
  size_t numToStart = 0;
  if (this->RunningCount < this->ParallelLevel) {
    numToStart = this->ParallelLevel - this->RunningCount;
  }

  if (numToStart == 0) {
    return;
  }

  // Don't start any new tests if one with the RUN_SERIAL property
  // is already running.
  if (this->SerialTestRunning) {
    return;
  }

  bool allTestsFailedTestLoadCheck = false;
  bool usedFakeLoadForTesting = false;
  size_t minProcessorsRequired = this->ParallelLevel;
  std::string testWithMinProcessors;

  cmsys::SystemInformation info;

  unsigned long systemLoad = 0;
  size_t spareLoad = 0;
  if (this->TestLoad > 0) {
    // Activate possible wait.
    allTestsFailedTestLoadCheck = true;

    // Check for a fake load average value used in testing.
    std::string fake_load_value;
    if (cmSystemTools::GetEnv("__CTEST_FAKE_LOAD_AVERAGE_FOR_TESTING",
                              fake_load_value)) {
      usedFakeLoadForTesting = true;
      if (!cmSystemTools::StringToULong(fake_load_value.c_str(),
                                        &systemLoad)) {
        cmSystemTools::Error("Failed to parse fake load value: ",
                             fake_load_value.c_str());
      }
    }
    // If it's not set, look up the true load average.
    else {
      systemLoad = static_cast<unsigned long>(ceil(info.GetLoadAverage()));
    }
    spareLoad =
      (this->TestLoad > systemLoad ? this->TestLoad - systemLoad : 0);

    // Don't start more tests than the spare load can support.
    if (numToStart > spareLoad) {
      numToStart = spareLoad;
    }
  }

  TestList copy = this->SortedTests;
  for (TestList::iterator test = copy.begin(); test != copy.end(); ++test) {
    // Take a nap if we're currently performing a RUN_SERIAL test.
    if (this->SerialTestRunning) {
      break;
    }
    // We can only start a RUN_SERIAL test if no other tests are also running.
    if (this->Properties[*test]->RunSerial && this->RunningCount > 0) {
      continue;
    }

    size_t processors = GetProcessorsUsed(*test);
    bool testLoadOk = true;
    if (this->TestLoad > 0) {
      if (processors <= spareLoad) {
        cmCTestLog(this->CTest, DEBUG, "OK to run "
                     << GetName(*test) << ", it requires " << processors
                     << " procs & system load is: " << systemLoad
                     << std::endl);
        allTestsFailedTestLoadCheck = false;
      } else {
        testLoadOk = false;
      }
    }

    if (processors <= minProcessorsRequired) {
      minProcessorsRequired = processors;
      testWithMinProcessors = GetName(*test);
    }

    if (testLoadOk && processors <= numToStart && this->StartTest(*test)) {
      if (this->StopTimePassed) {
        return;
      }

      numToStart -= processors;
    } else if (numToStart == 0) {
      break;
    }
  }

  if (allTestsFailedTestLoadCheck) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***** WAITING, ");
    if (this->SerialTestRunning) {
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "Waiting for RUN_SERIAL test to finish.");
    } else {
      /* clang-format off */
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "System Load: " << systemLoad << ", "
                 "Max Allowed Load: " << this->TestLoad << ", "
                 "Smallest test " << testWithMinProcessors <<
                 " requires " << minProcessorsRequired);
      /* clang-format on */
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "*****" << std::endl);

    if (usedFakeLoadForTesting) {
      // Break out of the infinite loop of waiting for our fake load
      // to come down.
      this->StopTimePassed = true;
    } else {
      // Wait between 1 and 5 seconds before trying again.
      cmCTestScriptHandler::SleepInSeconds(cmSystemTools::RandomSeed() % 5 +
                                           1);
    }
  }
}